

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O3

JavascriptError * __thiscall
Js::JavascriptError::CloneErrorMsgAndNumber
          (JavascriptError *this,JavascriptLibrary *targetJavascriptLibrary)

{
  int iVar1;
  HRESULT hr;
  undefined4 extraout_var;
  LPCWSTR local_30;
  LPCWSTR msg;
  JavascriptError *pError;
  
  iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])();
  pError = (JavascriptError *)CONCAT44(extraout_var,iVar1);
  if (pError != (JavascriptError *)0x0) {
    local_30 = (PCWSTR)0x0;
    hr = GetRuntimeError((RecyclableObject *)this,&local_30);
    SetErrorMessageProperties
              (pError,hr,local_30,
               (targetJavascriptLibrary->super_JavascriptLibraryBase).scriptContext.ptr);
  }
  return pError;
}

Assistant:

JavascriptError* JavascriptError::CloneErrorMsgAndNumber(JavascriptLibrary* targetJavascriptLibrary)
    {
        JavascriptError* jsNewError = this->CreateNewErrorOfSameType(targetJavascriptLibrary);
        if (jsNewError)
        {
            LPCWSTR msg = nullptr;
            HRESULT hr = JavascriptError::GetRuntimeError(this, &msg);
            jsNewError->SetErrorMessageProperties(jsNewError, hr, msg, targetJavascriptLibrary->GetScriptContext());
        }
        return jsNewError;
    }